

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O0

int FileReadCol(char *filename)

{
  FILE *__stream;
  size_t sVar1;
  int local_102c;
  char local_1028 [4];
  int j;
  char str [4096];
  int local_1c;
  int i;
  FILE *f;
  char *filename_local;
  
  __stream = fopen(filename,"r");
  local_1c = 0;
  fgets(local_1028,0x1000,__stream);
  local_102c = 0;
  while( true ) {
    sVar1 = strlen(local_1028);
    if (sVar1 <= (ulong)(long)local_102c) break;
    if (local_1028[local_102c] == ',') {
      local_1c = local_1c + 1;
    }
    local_102c = local_102c + 1;
  }
  printf(anon_var_dwarf_15f7,(ulong)(local_1c + 1U));
  return local_1c + 1U;
}

Assistant:

int FileReadCol(const char *filename) {
    FILE *f = fopen(filename, "r");
    int i = 0;
    char str[4096];
    fgets(str, 4096, f);
    for (int j = 0; j < strlen(str); j++) {
        if (',' == str[j]) i++;
    }
    i++;// 数据数=逗号数+1
    printf("数组列数：%d\n", i);
    return i;
}